

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

LY_ERR lyd_compare_single_schema
                 (lyd_node *node1,lyd_node *node2,uint32_t options,ly_bool parental_schemas_checked)

{
  ly_bool lVar1;
  lysc_node *plVar2;
  lysc_node *plVar3;
  ly_ctx *local_40;
  ly_ctx *local_30;
  ly_bool parental_schemas_checked_local;
  uint32_t options_local;
  lyd_node *node2_local;
  lyd_node *node1_local;
  
  if (node1->schema == (lysc_node *)0x0) {
    local_30 = (ly_ctx *)node1[2].schema;
  }
  else {
    local_30 = node1->schema->module->ctx;
  }
  if (node2->schema == (lysc_node *)0x0) {
    local_40 = (ly_ctx *)node2[2].schema;
  }
  else {
    local_40 = node2->schema->module->ctx;
  }
  if (local_30 == local_40) {
    if ((options & 4) == 0) {
      if (node1->schema != node2->schema) {
        return LY_ENOT;
      }
    }
    else {
      plVar2 = lyd_node_schema(node1);
      plVar3 = lyd_node_schema(node2);
      if (plVar2 != plVar3) {
        return LY_ENOT;
      }
    }
  }
  else {
    lVar1 = lyd_compare_schema_equal(node1->schema,node2->schema);
    if (lVar1 == '\0') {
      return LY_ENOT;
    }
    if ((parental_schemas_checked == '\0') &&
       (lVar1 = lyd_compare_schema_parents_equal(node1,node2), lVar1 == '\0')) {
      return LY_ENOT;
    }
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
lyd_compare_single_schema(const struct lyd_node *node1, const struct lyd_node *node2, uint32_t options,
        ly_bool parental_schemas_checked)
{
    if (LYD_CTX(node1) == LYD_CTX(node2)) {
        /* same contexts */
        if (options & LYD_COMPARE_OPAQ) {
            if (lyd_node_schema(node1) != lyd_node_schema(node2)) {
                return LY_ENOT;
            }
        } else {
            if (node1->schema != node2->schema) {
                return LY_ENOT;
            }
        }
    } else {
        /* different contexts */
        if (!lyd_compare_schema_equal(node1->schema, node2->schema)) {
            return LY_ENOT;
        }
        if (!parental_schemas_checked) {
            if (!lyd_compare_schema_parents_equal(node1, node2)) {
                return LY_ENOT;
            }
            parental_schemas_checked = 1;
        }
    }

    return LY_SUCCESS;
}